

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_add_core(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  uint uVar1;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  undefined8 uStack_40;
  
  if (global < 0) {
    pcVar10 = "invalid global node";
    uVar1 = 3;
    uVar6 = 0x11f;
    goto LAB_00180a01;
  }
  if (ref_node->blank != -1) goto LAB_0018095b;
  iVar9 = ref_node->max;
  lVar11 = (long)iVar9;
  iVar5 = 5000;
  if (5000 < (int)((double)iVar9 * 1.5)) {
    iVar5 = (int)((double)iVar9 * 1.5);
  }
  ref_node->max = iVar5 + iVar9;
  fflush(_stdout);
  pRVar2 = ref_node->global;
  if (0 < (long)ref_node->max) {
    pRVar2 = (REF_GLOB *)realloc(pRVar2,(long)ref_node->max << 3);
    ref_node->global = pRVar2;
  }
  if (pRVar2 == (REF_GLOB *)0x0) {
    pcVar10 = "realloc ref_node->global NULL";
    uVar6 = 0x125;
LAB_00180bcf:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
           "ref_node_add_core",pcVar10);
    uVar8 = (ulong)ref_node->max;
LAB_00180bdc:
    lVar11 = uVar8 * 8;
  }
  else {
    iVar5 = ref_node->max;
    lVar7 = -3 - lVar11;
    for (; lVar11 < iVar5; lVar11 = lVar11 + 1) {
      pRVar2[lVar11] = lVar7;
      lVar7 = lVar7 + -1;
    }
    pRVar2[(long)iVar5 + -1] = -1;
    ref_node->blank = -2 - iVar9;
    fflush(_stdout);
    pRVar2 = ref_node->sorted_global;
    if (0 < (long)ref_node->max) {
      pRVar2 = (REF_GLOB *)realloc(pRVar2,(long)ref_node->max << 3);
      ref_node->sorted_global = pRVar2;
    }
    if (pRVar2 == (REF_GLOB *)0x0) {
      pcVar10 = "realloc ref_node->sorted_global NULL";
      uVar6 = 299;
      goto LAB_00180bcf;
    }
    fflush(_stdout);
    pRVar3 = ref_node->sorted_local;
    if (0 < (long)ref_node->max) {
      pRVar3 = (REF_INT *)realloc(pRVar3,(long)ref_node->max << 2);
      ref_node->sorted_local = pRVar3;
    }
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar10 = "realloc ref_node->sorted_local NULL";
      uVar6 = 300;
LAB_00180c59:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
             "ref_node_add_core",pcVar10);
      uVar8 = (ulong)ref_node->max;
      lVar11 = uVar8 * 4;
      uStack_40 = 4;
      goto LAB_00180c77;
    }
    fflush(_stdout);
    pRVar3 = ref_node->part;
    if (0 < (long)ref_node->max) {
      pRVar3 = (REF_INT *)realloc(pRVar3,(long)ref_node->max << 2);
      ref_node->part = pRVar3;
    }
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar10 = "realloc ref_node->part NULL";
      uVar6 = 0x12e;
      goto LAB_00180c59;
    }
    fflush(_stdout);
    pRVar3 = ref_node->age;
    if (0 < (long)ref_node->max) {
      pRVar3 = (REF_INT *)realloc(pRVar3,(long)ref_node->max << 2);
      ref_node->age = pRVar3;
    }
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar10 = "realloc ref_node->age NULL";
      uVar6 = 0x12f;
      goto LAB_00180c59;
    }
    fflush(_stdout);
    if ((long)ref_node->max == 0) {
      pRVar4 = ref_node->real;
    }
    else {
      pRVar4 = (REF_DBL *)realloc(ref_node->real,(long)ref_node->max * 0x78);
      ref_node->real = pRVar4;
    }
    if (pRVar4 != (REF_DBL *)0x0) {
      if (ref_node->naux < 1) {
LAB_0018095b:
        iVar9 = -2 - ref_node->blank;
        *node = iVar9;
        ref_node->blank = (REF_INT)ref_node->global[iVar9];
        iVar9 = *node;
        ref_node->global[iVar9] = global;
        ref_node->part[iVar9] = ref_node->ref_mpi->id;
        ref_node->age[*node] = 0;
        uVar1 = ref_node_metric_form(ref_node,*node,1.0,0.0,0.0,1.0,0.0,1.0);
        if (uVar1 == 0) {
          ref_node->n = ref_node->n + 1;
          return 0;
        }
        pcVar10 = "set ident";
        uVar6 = 0x145;
LAB_00180a01:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar6,"ref_node_add_core",(ulong)uVar1,pcVar10);
        return uVar1;
      }
      fflush(_stdout);
      lVar11 = (long)ref_node->max * (long)ref_node->naux;
      pRVar4 = ref_node->aux;
      if (lVar11 != 0) {
        pRVar4 = (REF_DBL *)realloc(pRVar4,lVar11 * 8);
        ref_node->aux = pRVar4;
      }
      if (pRVar4 != (REF_DBL *)0x0) goto LAB_0018095b;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x13a,
             "ref_node_add_core","realloc ref_node->aux NULL");
      uVar8 = (long)ref_node->max * (long)ref_node->naux;
      goto LAB_00180bdc;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x134,
           "ref_node_add_core","realloc ref_node->real NULL");
    uVar8 = (long)ref_node->max * 0xf;
    lVar11 = (long)ref_node->max * 0x78;
  }
  uStack_40 = 8;
LAB_00180c77:
  printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar8 & 0xffffffff,uVar8,
         uStack_40,lVar11);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_node_add_core(REF_NODE ref_node, REF_GLOB global,
                                            REF_INT *node) {
  REF_INT orig, chunk, extra;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  if (REF_EMPTY == ref_node->blank) {
    orig = ref_node_max(ref_node);
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_node->max = orig + chunk;
    ref_realloc(ref_node->global, ref_node_max(ref_node), REF_GLOB);
    for (extra = orig; extra < ref_node_max(ref_node); extra++)
      ref_node->global[extra] = index2next(extra + 1);
    ref_node->global[ref_node_max(ref_node) - 1] = REF_EMPTY;
    ref_node->blank = index2next(orig);

    ref_realloc(ref_node->sorted_global, ref_node_max(ref_node), REF_GLOB);
    ref_realloc(ref_node->sorted_local, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->part, ref_node_max(ref_node), REF_INT);
    ref_realloc(ref_node->age, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->real,
                ((unsigned long)REF_NODE_REAL_PER *
                 (unsigned long)ref_node_max(ref_node)),
                REF_DBL);

    if (ref_node_naux(ref_node) > 0)
      ref_realloc(ref_node->aux,
                  ((unsigned long)ref_node_naux(ref_node) *
                   (unsigned long)ref_node_max(ref_node)),
                  REF_DBL);
  }

  *node = next2index(ref_node->blank);
  ref_node->blank = (REF_INT)ref_node->global[*node];

  ref_node->global[*node] = global;
  ref_node->part[*node] =
      ref_mpi_rank(ref_node_mpi(ref_node)); /*local default*/
  ref_node->age[*node] = 0;                 /* default new born */

  RSS(ref_node_metric_form(ref_node, *node, 1, 0, 0, 1, 0, 1), "set ident");

  (ref_node->n)++;
  return REF_SUCCESS;
}